

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

void MaybeInit(void)

{
  anon_class_1_0_00000001 local_9;
  
  std::call_once<MaybeInit()::_lambda()_1_>(&flag,&local_9);
  return;
}

Assistant:

inline static void MaybeInit() {
  std::call_once(flag, []{
    InitLookupCell(0, 0, 0, 0, 0, 0);
    InitLookupCell(0, 0, 0, kSwapMask, 0, kSwapMask);
    InitLookupCell(0, 0, 0, kInvertMask, 0, kInvertMask);
    InitLookupCell(0, 0, 0, kSwapMask|kInvertMask, 0, kSwapMask|kInvertMask);
  });
}